

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# create_type_info.cpp
# Opt level: O2

void __thiscall
duckdb::CreateTypeInfo::CreateTypeInfo
          (CreateTypeInfo *this,string *name_p,LogicalType *type_p,
          bind_logical_type_function_t bind_function_p)

{
  allocator local_62;
  allocator local_61;
  string local_60;
  string local_40;
  
  ::std::__cxx11::string::string((string *)&local_40,"main",&local_61);
  ::std::__cxx11::string::string((string *)&local_60,anon_var_dwarf_4b0ffdd + 9,&local_62);
  CreateInfo::CreateInfo(&this->super_CreateInfo,TYPE_ENTRY,&local_40,&local_60);
  ::std::__cxx11::string::~string((string *)&local_60);
  ::std::__cxx11::string::~string((string *)&local_40);
  (this->super_CreateInfo).super_ParseInfo._vptr_ParseInfo =
       (_func_int **)&PTR__CreateTypeInfo_027a82e0;
  ::std::__cxx11::string::string((string *)&this->name,(string *)name_p);
  LogicalType::LogicalType(&this->type,type_p);
  (this->query).super_unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>_>.
  _M_t.super___uniq_ptr_impl<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::SQLStatement_*,_std::default_delete<duckdb::SQLStatement>_>.
  super__Head_base<0UL,_duckdb::SQLStatement_*,_false>._M_head_impl = (SQLStatement *)0x0;
  this->bind_function = bind_function_p;
  return;
}

Assistant:

CreateTypeInfo::CreateTypeInfo(string name_p, LogicalType type_p, bind_logical_type_function_t bind_function_p)
    : CreateInfo(CatalogType::TYPE_ENTRY), name(std::move(name_p)), type(std::move(type_p)),
      bind_function(bind_function_p) {
}